

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::DumpChildren(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  streamoff sVar1;
  string local_1d8;
  fpos local_1b8 [32];
  ostringstream local_198 [8];
  ostringstream ss;
  int indent_local;
  bool binary_local;
  StreamWriterLE *s_local;
  Node *this_local;
  
  if (binary) {
    DumpChildrenBinary(this,s);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    DumpChildrenAscii(this,(ostream *)local_198,indent);
    local_1b8._0_16_ = std::ostream::tellp();
    sVar1 = std::fpos::operator_cast_to_long(local_1b8);
    if (0 < sVar1) {
      std::__cxx11::ostringstream::str();
      StreamWriter<false,_false>::PutString(s,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void FBX::Node::DumpChildren(
    Assimp::StreamWriterLE& s,
    bool binary, int indent
) {
    if (binary) {
        DumpChildrenBinary(s);
    } else {
        std::ostringstream ss;
        DumpChildrenAscii(ss, indent);
        if (ss.tellp() > 0)
            s.PutString(ss.str());
    }
}